

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFImporter.cpp
# Opt level: O0

bool __thiscall
Assimp::D3MF::XmlSerializer::parseColor(XmlSerializer *this,char *color,aiColor4D *diffuse)

{
  size_t sVar1;
  long lVar2;
  char local_3b;
  char local_3a;
  char *pcStack_38;
  char comp [3];
  char *buf;
  size_t len;
  aiColor4D *diffuse_local;
  char *color_local;
  XmlSerializer *this_local;
  
  if (color == (char *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sVar1 = strlen(color);
    if ((sVar1 == 9) || (sVar1 == 7)) {
      if (*color == '#') {
        pcStack_38 = color + 1;
        memset(&local_3b,0,3);
        local_3b = *pcStack_38;
        local_3a = pcStack_38[1];
        pcStack_38 = pcStack_38 + 2;
        lVar2 = strtol(&local_3b,(char **)0x0,0x10);
        diffuse->r = (float)lVar2 / 255.0;
        local_3b = *pcStack_38;
        local_3a = pcStack_38[1];
        pcStack_38 = pcStack_38 + 2;
        lVar2 = strtol(&local_3b,(char **)0x0,0x10);
        diffuse->g = (float)lVar2 / 255.0;
        local_3b = *pcStack_38;
        local_3a = pcStack_38[1];
        pcStack_38 = pcStack_38 + 2;
        lVar2 = strtol(&local_3b,(char **)0x0,0x10);
        diffuse->b = (float)lVar2 / 255.0;
        if (sVar1 == 7) {
          this_local._7_1_ = true;
        }
        else {
          local_3b = *pcStack_38;
          local_3a = pcStack_38[1];
          pcStack_38 = pcStack_38 + 2;
          lVar2 = strtol(&local_3b,(char **)0x0,0x10);
          diffuse->a = (float)lVar2 / 255.0;
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool parseColor( const char *color, aiColor4D &diffuse ) {
        if ( nullptr == color ) {
            return false;
        }

        //format of the color string: #RRGGBBAA or #RRGGBB (3MF Core chapter 5.1.1)
        const size_t len( strlen( color ) );
        if ( 9 != len && 7 != len) {
            return false;
        }

        const char *buf( color );
        if ( '#' != *buf ) {
            return false;
        }
        ++buf;
        char comp[ 3 ] = { 0,0,'\0' };

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.r = static_cast<ai_real>( strtol( comp, NULL, 16 ) ) / ai_real(255.0);


        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.g = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.b = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        if(7 == len)
            return true;
        comp[ 0 ] = *buf;
        ++buf;
        comp[ 1 ] = *buf;
        ++buf;
        diffuse.a = static_cast< ai_real >( strtol( comp, NULL, 16 ) ) / ai_real(255.0);

        return true;
    }